

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O2

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::mapNext
          (JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  SimpleParser<avro::parsing::JsonDecoderHandler> *this_00;
  Token TVar1;
  
  this_00 = &this->parser_;
  SimpleParser<avro::parsing::JsonDecoderHandler>::processImplicitActions(this_00);
  TVar1 = json::JsonParser::peek(&this->in_);
  if (TVar1 != tkObjectEnd) {
    SimpleParser<avro::parsing::JsonDecoderHandler>::setRepeatCount(this_00,1);
  }
  else {
    json::JsonParser::advance(&this->in_);
    SimpleParser<avro::parsing::JsonDecoderHandler>::popRepeater(this_00);
    SimpleParser<avro::parsing::JsonDecoderHandler>::advance(this_00,sMapEnd);
  }
  return (ulong)(TVar1 != tkObjectEnd);
}

Assistant:

size_t JsonDecoder<P>::mapNext()
{
    parser_.processImplicitActions();
    if (in_.peek() == JsonParser::tkObjectEnd) {
        in_.advance();
        parser_.popRepeater();
        parser_.advance(Symbol::sMapEnd);
        return 0;
    }
    parser_.setRepeatCount(1);
    return 1;
}